

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

TimeData *
helics::generateMinTimeUpstream
          (TimeData *__return_storage_ptr__,TimeDependencies *dependencies,bool restricted,
          GlobalFederateId self,GlobalFederateId ignore,int32_t responseCode)

{
  pointer pDVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  DependencyInfo *dep;
  pointer dep_00;
  
  iVar4 = 0;
  TimeData::TimeData(__return_storage_ptr__,(Time)0x7fffffffffffffff,error,'\0');
  pDVar1 = (dependencies->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (dep_00 = (dependencies->dependencies).
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; dep_00 != pDVar1; dep_00 = dep_00 + 1) {
    if (((dep_00->dependency == true) && (dep_00->connection != PARENT)) &&
       ((self.gid == -2010000000 ||
        ((self.gid == -1700000000 || ((dep_00->super_TimeData).minFedActual.gid != self.gid)))))) {
      iVar4 = iVar4 + (dep_00->super_TimeData).sequenceCounter;
      generateMinTimeImplementation(__return_storage_ptr__,dep_00,ignore,responseCode);
    }
  }
  lVar2 = (__return_storage_ptr__->Te).internalTimeCode;
  lVar3 = (__return_storage_ptr__->minDe).internalTimeCode;
  if (lVar2 < lVar3) {
    (__return_storage_ptr__->minDe).internalTimeCode = lVar2;
    lVar3 = lVar2;
  }
  if ((!restricted) && ((__return_storage_ptr__->next).internalTimeCode < lVar3)) {
    (__return_storage_ptr__->next).internalTimeCode = lVar3;
  }
  __return_storage_ptr__->sequenceCounter = iVar4;
  if (__return_storage_ptr__->mTimeState < time_granted) {
    *(undefined4 *)&(__return_storage_ptr__->next).internalTimeCode = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->next).internalTimeCode + 4) = 0xffffffff;
    *(undefined4 *)&(__return_storage_ptr__->Te).internalTimeCode = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->Te).internalTimeCode + 4) = 0xffffffff;
    (__return_storage_ptr__->minDe).internalTimeCode = -1;
  }
  return __return_storage_ptr__;
}

Assistant:

TimeData generateMinTimeUpstream(const TimeDependencies& dependencies,
                                 bool restricted,
                                 GlobalFederateId self,
                                 GlobalFederateId ignore,
                                 std::int32_t responseCode)
{
    TimeData mTime(Time::maxVal(), TimeState::error);
    std::int32_t iterationCount{0};
    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.connection == ConnectionType::PARENT) {
            continue;
        }
        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        iterationCount += dep.sequenceCounter;
        generateMinTimeImplementation(mTime, dep, ignore, responseCode);
    }
    if (mTime.Te < mTime.minDe) {
        mTime.minDe = mTime.Te;
    }

    if (!restricted) {
        if (mTime.minDe > mTime.next) {
            mTime.next = mTime.minDe;
        }
    }
    mTime.sequenceCounter = iterationCount;
    if (mTime.mTimeState < TimeState::time_granted) {
        mTime.next = initializationTime;
        mTime.minDe = initializationTime;
        mTime.Te = initializationTime;
    }
    return mTime;
}